

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_byte(lua_State *L)

{
  int space;
  char *pcVar1;
  lua_Integer lVar2;
  int local_40;
  int i;
  int n;
  lua_Integer pose;
  lua_Integer posi;
  char *s;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  lVar2 = luaL_optinteger((lua_State *)l,2,1);
  pose = posrelat(lVar2,(size_t)s);
  lVar2 = luaL_optinteger((lua_State *)l,3,pose);
  _i = (char *)posrelat(lVar2,(size_t)s);
  if (pose < 1) {
    pose = 1;
  }
  if ((long)s < (long)_i) {
    _i = s;
  }
  if ((long)_i < pose) {
    L_local._4_4_ = 0;
  }
  else if ((long)_i - pose < 0x7fffffff) {
    space = ((int)_i - (int)pose) + 1;
    luaL_checkstack((lua_State *)l,space,"string slice too long");
    for (local_40 = 0; L_local._4_4_ = space, local_40 < space; local_40 = local_40 + 1) {
      lua_pushinteger((lua_State *)l,(ulong)(byte)pcVar1[pose + local_40 + -1]);
    }
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)l,"string slice too long");
  }
  return L_local._4_4_;
}

Assistant:

static int str_byte(lua_State *L) {
    size_t l;
    const char *s = luaL_checklstring(L, 1, &l);
    lua_Integer posi = posrelat(luaL_optinteger(L, 2, 1), l);
    lua_Integer pose = posrelat(luaL_optinteger(L, 3, posi), l);
    int n, i;
    if (posi < 1) posi = 1;
    if (pose > (lua_Integer) l) pose = l;
    if (posi > pose) return 0;  /* empty interval; return no values */
    if (pose - posi >= INT_MAX)  /* arithmetic overflow? */
        return luaL_error(L, "string slice too long");
    n = (int) (pose - posi) + 1;
    luaL_checkstack(L, n, "string slice too long");
    for (i = 0; i < n; i++)
        lua_pushinteger(L, uchar(s[posi + i - 1]));
    return n;
}